

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
::ReadReference(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                *this)

{
  char cVar1;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  *in_RDI;
  BinaryReaderBase *in_stack_00000008;
  CStringRef in_stack_00000010;
  BasicCStringRef<char> local_10 [2];
  
  cVar1 = ReaderBase::ReadChar((ReaderBase *)in_RDI->reader_);
  if (cVar1 != 'v') {
    fmt::BasicCStringRef<char>::BasicCStringRef(local_10,"expected reference");
    BinaryReaderBase::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  DoReadReference(in_RDI);
  return;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }